

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::TestRegistry::getMatchingTestCases
          (TestRegistry *this,TestCaseFilters *filters,
          vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *matchingTestsOut)

{
  bool bVar1;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  *in_RDX;
  value_type *in_RSI;
  TestCaseFilters *in_RDI;
  const_iterator itEnd;
  const_iterator it;
  vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *in_stack_ffffffffffffffb8;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  *in_stack_ffffffffffffffc0;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  local_20;
  __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
  *local_18;
  value_type *testCase;
  TestCaseFilters *this_00;
  
  local_18 = in_RDX;
  this_00 = in_RDI;
  local_20._M_current =
       (TestCase *)
       std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::begin
                 (in_stack_ffffffffffffffb8);
  std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::end(in_stack_ffffffffffffffb8);
  while (bVar1 = __gnu_cxx::operator!=
                           (in_stack_ffffffffffffffc0,
                            (__normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
                             *)in_stack_ffffffffffffffb8), bVar1) {
    testCase = in_RSI;
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator*(&local_20);
    bVar1 = TestCaseFilters::shouldInclude(this_00,testCase);
    if (bVar1) {
      in_stack_ffffffffffffffc0 = local_18;
      __gnu_cxx::
      __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
      ::operator*(&local_20);
      std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>::push_back
                ((vector<Catch::TestCase,_std::allocator<Catch::TestCase>_> *)in_RDI,in_RSI);
    }
    in_RSI = testCase;
    __gnu_cxx::
    __normal_iterator<const_Catch::TestCase_*,_std::vector<Catch::TestCase,_std::allocator<Catch::TestCase>_>_>
    ::operator++(&local_20);
  }
  return;
}

Assistant:

virtual void getMatchingTestCases( TestCaseFilters const& filters, std::vector<TestCase>& matchingTestsOut ) const {
            std::vector<TestCase>::const_iterator it = m_functionsInOrder.begin();
            std::vector<TestCase>::const_iterator itEnd = m_functionsInOrder.end();
            // !TBD: replace with algorithm
            for(; it != itEnd; ++it )
                if( filters.shouldInclude( *it ) )
                    matchingTestsOut.push_back( *it );
        }